

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

bool google::GetSectionHeaderByName(int fd,char *name,size_t name_len,Elf64_Shdr *out)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  off_t section_header_offset;
  off_t offset;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  Elf64_Ehdr elf_header;
  char header_name [64];
  Elf64_Shdr shstrtab;
  undefined1 local_f8 [40];
  long local_d0;
  ushort local_be;
  ushort local_bc;
  ushort local_ba;
  undefined1 local_b8 [72];
  undefined1 local_70 [24];
  long local_58;
  
  bVar4 = false;
  sVar2 = ReadFromOffset(fd,local_f8,0x40,0);
  if (sVar2 == 0x40) {
    sVar2 = ReadFromOffset(fd,local_70,0x40,(ulong)local_ba * (ulong)local_be + local_d0);
    if (sVar2 == 0x40) {
      offset = local_d0;
      for (uVar5 = (ulong)local_bc; uVar5 != 0; uVar5 = uVar5 - 1) {
        sVar2 = ReadFromOffset(fd,out,0x40,offset);
        if (sVar2 == 0x40) {
          if (name_len < 0x41) {
            sVar3 = ReadFromOffset(fd,local_b8,name_len,(ulong)out->sh_name + local_58);
            if (sVar3 == 0xffffffffffffffff) {
              bVar6 = true;
              bVar4 = false;
            }
            else {
              bVar6 = false;
              if (sVar3 == name_len) {
                iVar1 = bcmp(local_b8,name,name_len);
                bVar6 = iVar1 == 0;
                bVar4 = (bool)(bVar4 | bVar6);
              }
            }
          }
          else {
            bVar4 = false;
            bVar6 = true;
            RawLog__(1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/symbolize.cc"
                     ,0xf9,
                     "Section name \'%s\' is too long (%zu); section will not be found (even if present)."
                     ,name,name_len);
          }
        }
        else {
          bVar6 = true;
          bVar4 = false;
        }
        if (bVar6) {
          return bVar4;
        }
        offset = offset + (ulong)local_be;
      }
    }
  }
  return false;
}

Assistant:

bool GetSectionHeaderByName(int fd, const char *name, size_t name_len,
                            ElfW(Shdr) *out) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) shstrtab;
  off_t shstrtab_offset = (elf_header.e_shoff +
                           elf_header.e_shentsize * elf_header.e_shstrndx);
  if (!ReadFromOffsetExact(fd, &shstrtab, sizeof(shstrtab), shstrtab_offset)) {
    return false;
  }

  for (int i = 0; i < elf_header.e_shnum; ++i) {
    off_t section_header_offset = (elf_header.e_shoff +
                                   elf_header.e_shentsize * i);
    if (!ReadFromOffsetExact(fd, out, sizeof(*out), section_header_offset)) {
      return false;
    }
    char header_name[kMaxSectionNameLen];
    if (sizeof(header_name) < name_len) {
      RAW_LOG(WARNING, "Section name '%s' is too long (%" PRIuS "); "
              "section will not be found (even if present).", name, name_len);
      // No point in even trying.
      return false;
    }
    off_t name_offset = shstrtab.sh_offset + out->sh_name;
    ssize_t n_read = ReadFromOffset(fd, &header_name, name_len, name_offset);
    if (n_read == -1) {
      return false;
    } else if (n_read != name_len) {
      // Short read -- name could be at end of file.
      continue;
    }
    if (memcmp(header_name, name, name_len) == 0) {
      return true;
    }
  }
  return false;
}